

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS ref_egads_edge_trange(REF_GEOM ref_geom,REF_INT id,REF_DBL *trange)

{
  printf("No EGADS linked for %s\n","ref_egads_edge_trange");
  *trange = 0.0;
  trange[1] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_edge_trange(REF_GEOM ref_geom, REF_INT id,
                                         REF_DBL *trange) {
#ifdef HAVE_EGADS
  ego *edges;
  ego object;
  int periodic;
  int status;
  RNS(ref_geom->edges, "edges not loaded");
  edges = (ego *)(ref_geom->edges);
  RAS(1 <= id && id <= ref_geom->nedge, "edge id out of range");
  object = edges[id - 1];
  status = EG_getRange(object, trange, &periodic);
  /* returns -2 EGADS_NULLOBJ for EGADSlite of hemisphere
     REIB(EGADS_SUCCESS, EG_getRange(edge_ego, trange, &periodic),
     "edge trange", {
     printf("for edge %d (%p) face %d\n", edgeid, (void *)edge_ego,
     ref_geom_id(ref_geom, geom));
     });
  */
  /* use EG_getTopology as an alternate to EG_getRange */
  if (EGADS_NULLOBJ == status) {
    ego ref, *pchldrn;
    int oclass, mtype, nchild, *psens;
    REIS(EGADS_SUCCESS,
         EG_getTopology(object, &ref, &oclass, &mtype, trange, &nchild,
                        &pchldrn, &psens),
         "topo for edge range");
  } else {
    REIS(EGADS_SUCCESS, status, "edge range");
  }
  return REF_SUCCESS;
#else
  printf("No EGADS linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(id);
  trange[0] = 0.0;
  trange[1] = 0.0;
  return REF_IMPLEMENT;
#endif
}